

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_class_prob(ngram_class_t *lmclass,int32 wid)

{
  int iVar1;
  ngram_hash_s *pnVar2;
  int32 iVar3;
  int32 *piVar4;
  uint uVar5;
  
  uVar5 = wid & 0xffffff;
  iVar1 = lmclass->start_wid;
  if (((int)uVar5 < iVar1) || (iVar1 + lmclass->n_words < (int)uVar5)) {
    iVar3 = 1;
    for (uVar5 = lmclass->n_hash - 1U & wid; uVar5 != 0xffffffff; uVar5 = pnVar2[(int)uVar5].next) {
      pnVar2 = lmclass->nword_hash;
      if (pnVar2[(int)uVar5].wid == wid) {
        piVar4 = &pnVar2[(int)uVar5].prob1;
        goto LAB_00130cf4;
      }
    }
  }
  else {
    piVar4 = lmclass->prob1 + (int)(uVar5 - iVar1);
LAB_00130cf4:
    iVar3 = *piVar4;
  }
  return iVar3;
}

Assistant:

int32
ngram_class_prob(ngram_class_t * lmclass, int32 wid)
{
    int32 base_wid = NGRAM_BASEWID(wid);

    if (base_wid < lmclass->start_wid
        || base_wid > lmclass->start_wid + lmclass->n_words) {
        int32 hash;

        /* Look it up in the hash table. */
        hash = wid & (lmclass->n_hash - 1);
        while (hash != -1 && lmclass->nword_hash[hash].wid != wid)
            hash = lmclass->nword_hash[hash].next;
        if (hash == -1)
            return 1;
        return lmclass->nword_hash[hash].prob1;
    }
    else {
        return lmclass->prob1[base_wid - lmclass->start_wid];
    }
}